

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O3

ostream * AML::operator<<(ostream *os,Vector3 *obj)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector3& obj)
    {
        os << "[" << obj.x << ", " << obj.y << ", " << obj.z << "]";
        return os;
    }